

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeQueue.h
# Opt level: O3

void __thiscall
NotLockFreeQueue<std::packaged_task<void_()>_>::pop_and_wait
          (NotLockFreeQueue<std::packaged_task<void_()>_> *this,packaged_task<void_()> *item)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Elt_pointer ppVar3;
  unique_lock<std::mutex> m;
  unique_lock<std::mutex> local_48;
  packaged_task<void_()> local_38;
  
  local_48._M_device = &this->mutex;
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  ppVar3 = (this->queue).c.
           super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->queue).c.
      super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar3) {
    do {
      std::condition_variable::wait((unique_lock *)&this->cond_var_pop);
      ppVar3 = (this->queue).c.
               super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->queue).c.
             super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar3);
  }
  peVar1 = (ppVar3->_M_state).
           super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (ppVar3->_M_state).
           super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (ppVar3->_M_state).
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (ppVar3->_M_state).
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (item->_M_state).
           super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_38._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (item->_M_state).
       super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  (item->_M_state).
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  (item->_M_state).
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  std::packaged_task<void_()>::~packaged_task(&local_38);
  std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>::pop_front
            ((deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_> *)
             this);
  std::unique_lock<std::mutex>::unlock(&local_48);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return;
}

Assistant:

void NotLockFreeQueue<T>::pop_and_wait(T& item) {
    std::unique_lock<std::mutex> m(mutex);
    if (queue.empty()) {
        cond_var_pop.wait(m, [this]{return !queue.empty();});
    }
    item = std::move(queue.front());
    queue.pop();
    m.unlock();
    cond_var_push.notify_one();
}